

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

int parse_der_signature(uchar *der,size_t len,mp_int *r,mp_int *s)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  uchar *b;
  long in_RSI;
  byte *in_RDI;
  size_t length_1;
  size_t length;
  uchar *end;
  uchar *in_stack_ffffffffffffffc0;
  mp_int *in_stack_ffffffffffffffc8;
  byte *local_10 [2];
  
  pbVar3 = in_RDI + in_RSI;
  if ((((int)(uint)*in_RDI >> 5 & 1U) == 1) && ((*in_RDI & 0x1f) == 0x10)) {
    pbVar4 = in_RDI + 1;
    local_10[0] = pbVar4;
    sVar5 = _parse_length(local_10);
    if (pbVar3 < pbVar4 + sVar5) {
      return 0;
    }
    iVar2 = (int)((ulong)pbVar4 >> 0x20);
    if ((((int)(uint)*local_10[0] >> 5 & 1U) == 0) && ((*local_10[0] & 0x1f) == 2)) {
      local_10[0] = local_10[0] + 1;
      in_stack_ffffffffffffffc8 = (mp_int *)_parse_length(local_10);
      if (pbVar3 < local_10[0] + (long)in_stack_ffffffffffffffc8) {
        return 0;
      }
      iVar1 = mp_read_unsigned_bin(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,iVar2);
      if (iVar1 != 0) {
        return 0;
      }
      local_10[0] = local_10[0] + (long)&in_stack_ffffffffffffffc8->used;
    }
    if ((((int)(uint)*local_10[0] >> 5 & 1U) == 0) && ((*local_10[0] & 0x1f) == 2)) {
      local_10[0] = local_10[0] + 1;
      b = (uchar *)_parse_length(local_10);
      if (pbVar3 < local_10[0] + (long)b) {
        return 0;
      }
      iVar2 = mp_read_unsigned_bin(in_stack_ffffffffffffffc8,b,iVar2);
      return (uint)(iVar2 == 0);
    }
  }
  return 0;
}

Assistant:

int parse_der_signature(const unsigned char* der, size_t len, mp_int* r, mp_int* s)
{
	const unsigned char* end = der + len;

	SEQUENCE
	{
		if ((++der + _parse_length(&der)) > end)
			return 0;

		INTEGER
		{
			// r
			der++;
			size_t length = _parse_length(&der);

			if ((der + length) > end)
				return 0;

			if (mp_read_unsigned_bin(r, der, length) != MP_OKAY)
				return 0;

			der += length;
		}

		INTEGER
		{
			// s
			der++;
			size_t length = _parse_length(&der);

			if ((der + length) > end)
				return 0;

			return (mp_read_unsigned_bin(s, der, length) == MP_OKAY);
		}
	}

	return 0;
}